

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O3

void av1_loop_restoration_alloc
               (AV1LrSync *lr_sync,AV1_COMMON *cm,int num_workers,int num_rows_lr,int num_planes,
               int width)

{
  char *pcVar1;
  RestorationLineBuffers *pRVar2;
  long lVar3;
  ulong uVar4;
  pthread_mutex_t *ppVar5;
  pthread_cond_t *ppVar6;
  LRWorkerData *pLVar7;
  void *pvVar8;
  int *piVar9;
  AV1LrMTInfo *pAVar10;
  ulong uVar11;
  long lVar12;
  pthread_cond_t **pppVar13;
  
  lr_sync->rows = num_rows_lr;
  lr_sync->num_planes = num_planes;
  lVar3 = (long)num_rows_lr;
  if (0 < num_planes) {
    uVar4 = 1;
    if (1 < num_rows_lr) {
      uVar4 = (ulong)(uint)num_rows_lr;
    }
    uVar11 = 0;
    do {
      ppVar5 = (pthread_mutex_t *)aom_malloc(lVar3 * 0x28);
      lr_sync->mutex_[uVar11] = ppVar5;
      if (ppVar5 == (pthread_mutex_t *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lr_sync->mutex_[j]");
        if (lr_sync->mutex_[uVar11] != (pthread_mutex_t *)0x0 && 0 < num_rows_lr) goto LAB_003ab22f;
LAB_003ab249:
        ppVar6 = (pthread_cond_t *)aom_malloc(lVar3 * 0x30);
        pppVar13 = lr_sync->cond_ + uVar11;
        *pppVar13 = ppVar6;
        if (ppVar6 == (pthread_cond_t *)0x0) {
LAB_003ab26d:
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lr_sync->cond_[j]");
          if (*pppVar13 == (pthread_cond_t *)0x0 || num_rows_lr < 1) goto LAB_003ab2b7;
        }
        else if (num_rows_lr < 1) goto LAB_003ab2b7;
        lVar12 = 0;
        do {
          pthread_cond_init((pthread_cond_t *)((long)*pppVar13 + lVar12),(pthread_condattr_t *)0x0);
          lVar12 = lVar12 + 0x30;
        } while (uVar4 * 0x30 != lVar12);
      }
      else {
        if (0 < num_rows_lr) {
LAB_003ab22f:
          lVar12 = 0;
          do {
            pthread_mutex_init((pthread_mutex_t *)((long)lr_sync->mutex_[uVar11] + lVar12),
                               (pthread_mutexattr_t *)0x0);
            lVar12 = lVar12 + 0x28;
          } while (uVar4 * 0x28 != lVar12);
          goto LAB_003ab249;
        }
        ppVar6 = (pthread_cond_t *)aom_malloc(lVar3 * 0x30);
        lr_sync->cond_[uVar11] = ppVar6;
        if (ppVar6 == (pthread_cond_t *)0x0) {
          pppVar13 = lr_sync->cond_ + uVar11;
          goto LAB_003ab26d;
        }
      }
LAB_003ab2b7:
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)num_planes);
  }
  ppVar5 = (pthread_mutex_t *)aom_malloc(0x28);
  lr_sync->job_mutex = ppVar5;
  if (ppVar5 == (pthread_mutex_t *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lr_sync->job_mutex");
    ppVar5 = lr_sync->job_mutex;
    if (ppVar5 == (pthread_mutex_t *)0x0) goto LAB_003ab307;
  }
  pthread_mutex_init((pthread_mutex_t *)ppVar5,(pthread_mutexattr_t *)0x0);
LAB_003ab307:
  pLVar7 = (LRWorkerData *)aom_calloc((long)num_workers,0x1c0);
  lr_sync->lrworkerdata = pLVar7;
  if (pLVar7 == (LRWorkerData *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lr_sync->lrworkerdata");
  }
  lr_sync->num_workers = num_workers;
  if (0 < num_workers) {
    lVar12 = 8;
    uVar4 = 0;
    do {
      if (uVar4 < num_workers - 1) {
        pvVar8 = aom_memalign(0x10,0x13b9a0);
        *(void **)((lr_sync->lrworkerdata->error_info).detail + lVar12 + -0x30) = pvVar8;
        if (pvVar8 == (void *)0x0) {
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate lr_sync->lrworkerdata[worker_idx].rst_tmpbuf");
        }
        pvVar8 = aom_malloc(0x1260);
        *(void **)((lr_sync->lrworkerdata->error_info).detail + lVar12 + -0x28) = pvVar8;
        if (pvVar8 == (void *)0x0) {
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate lr_sync->lrworkerdata[worker_idx].rlbs");
        }
      }
      else {
        pRVar2 = cm->rlbs;
        pcVar1 = (lr_sync->lrworkerdata->error_info).detail + lVar12 + -0x30;
        *(int32_t **)pcVar1 = cm->rst_tmpbuf;
        *(RestorationLineBuffers **)(pcVar1 + 8) = pRVar2;
      }
      uVar4 = uVar4 + 1;
      lVar12 = lVar12 + 0x1c0;
    } while ((uint)num_workers != uVar4);
  }
  if (0 < num_planes) {
    uVar4 = 0;
    do {
      piVar9 = (int *)aom_malloc(lVar3 * 4);
      lr_sync->cur_sb_col[uVar4] = piVar9;
      if (piVar9 == (int *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lr_sync->cur_sb_col[j]"
                          );
      }
      uVar4 = uVar4 + 1;
    } while ((uint)num_planes != uVar4);
  }
  pAVar10 = (AV1LrMTInfo *)aom_malloc(lVar3 * num_planes * 0x1c);
  lr_sync->job_queue = pAVar10;
  if (pAVar10 == (AV1LrMTInfo *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate lr_sync->job_queue");
  }
  lr_sync->sync_range = 1;
  return;
}

Assistant:

void av1_loop_restoration_alloc(AV1LrSync *lr_sync, AV1_COMMON *cm,
                                int num_workers, int num_rows_lr,
                                int num_planes, int width) {
  lr_sync->rows = num_rows_lr;
  lr_sync->num_planes = num_planes;
#if CONFIG_MULTITHREAD
  {
    int i, j;

    for (j = 0; j < num_planes; j++) {
      CHECK_MEM_ERROR(cm, lr_sync->mutex_[j],
                      aom_malloc(sizeof(*(lr_sync->mutex_[j])) * num_rows_lr));
      if (lr_sync->mutex_[j]) {
        for (i = 0; i < num_rows_lr; ++i) {
          pthread_mutex_init(&lr_sync->mutex_[j][i], NULL);
        }
      }

      CHECK_MEM_ERROR(cm, lr_sync->cond_[j],
                      aom_malloc(sizeof(*(lr_sync->cond_[j])) * num_rows_lr));
      if (lr_sync->cond_[j]) {
        for (i = 0; i < num_rows_lr; ++i) {
          pthread_cond_init(&lr_sync->cond_[j][i], NULL);
        }
      }
    }

    CHECK_MEM_ERROR(cm, lr_sync->job_mutex,
                    aom_malloc(sizeof(*(lr_sync->job_mutex))));
    if (lr_sync->job_mutex) {
      pthread_mutex_init(lr_sync->job_mutex, NULL);
    }
  }
#endif  // CONFIG_MULTITHREAD
  CHECK_MEM_ERROR(cm, lr_sync->lrworkerdata,
                  aom_calloc(num_workers, sizeof(*(lr_sync->lrworkerdata))));
  lr_sync->num_workers = num_workers;

  for (int worker_idx = 0; worker_idx < num_workers; ++worker_idx) {
    if (worker_idx < num_workers - 1) {
      CHECK_MEM_ERROR(cm, lr_sync->lrworkerdata[worker_idx].rst_tmpbuf,
                      (int32_t *)aom_memalign(16, RESTORATION_TMPBUF_SIZE));
      CHECK_MEM_ERROR(cm, lr_sync->lrworkerdata[worker_idx].rlbs,
                      aom_malloc(sizeof(RestorationLineBuffers)));

    } else {
      lr_sync->lrworkerdata[worker_idx].rst_tmpbuf = cm->rst_tmpbuf;
      lr_sync->lrworkerdata[worker_idx].rlbs = cm->rlbs;
    }
  }

  for (int j = 0; j < num_planes; j++) {
    CHECK_MEM_ERROR(
        cm, lr_sync->cur_sb_col[j],
        aom_malloc(sizeof(*(lr_sync->cur_sb_col[j])) * num_rows_lr));
  }
  CHECK_MEM_ERROR(
      cm, lr_sync->job_queue,
      aom_malloc(sizeof(*(lr_sync->job_queue)) * num_rows_lr * num_planes));
  // Set up nsync.
  lr_sync->sync_range = get_lr_sync_range(width);
}